

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O1

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  pointer pbVar10;
  undefined8 uVar11;
  size_type sVar12;
  string *psVar13;
  long lVar14;
  cmTarget *this;
  ulong uVar15;
  ulong uVar16;
  string *__x;
  byte bVar17;
  undefined4 uVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  undefined1 auVar19 [16];
  __single_object cc;
  string filename;
  cmCustomCommandLine currentLine;
  string comment_buffer;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string job_pool;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_260;
  undefined8 local_240;
  char *local_238;
  ulong local_230;
  string local_228;
  undefined8 local_208;
  cmExecutionStatus *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  uint local_1cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined8 local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  cmMakefile *local_190;
  undefined8 local_188;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined8 local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  bool local_128;
  undefined7 uStack_127;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string *local_d8;
  pointer local_d0;
  string local_c8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_c8.field_2._M_allocated_capacity = local_260.field_2._M_allocated_capacity;
    local_c8._M_dataplus._M_p = local_260._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p == &local_260.field_2) {
      return false;
    }
LAB_0032b5c8:
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
    return false;
  }
  pcVar2 = status->Makefile;
  auVar19 = std::__cxx11::string::find_first_of((char *)pbVar10,0x785160,0);
  if (auVar19._0_8_ != -1) {
    local_260.field_2._8_8_ = (pbVar10->_M_dataplus)._M_p;
    local_260.field_2._M_allocated_capacity = pbVar10->_M_string_length;
    local_260._M_dataplus._M_p = (pointer)0x21;
    local_260._M_string_length = 0x77b2bc;
    local_240 = 0x54;
    local_238 = 
    "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files.";
    views._M_len = 3;
    views._M_array = (iterator)&local_260;
    cmCatViews_abi_cxx11_(&local_c8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      return false;
    }
    goto LAB_0032b5c8;
  }
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = 0;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._8_8_ = 0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168 = 0;
  local_178._M_allocated_capacity = 0;
  local_178._8_8_ = 0;
  local_138._M_allocated_capacity = (size_type)&local_128;
  local_138._8_8_ = 0;
  local_128 = false;
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_allocated_capacity = (size_type)&local_148;
  local_158._8_8_ = 0;
  local_148._M_local_buf[0] = '\0';
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 1;
  local_1cc = (uint)CONCAT71(auVar19._9_7_,1);
  local_200 = status;
  local_190 = pcVar2;
  local_d0 = pbVar10;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
    iVar8 = std::__cxx11::string::compare((char *)(pbVar3 + 1));
    local_1cc = (uint)(iVar8 != 0);
    uVar9 = 2 - local_1cc;
  }
  uVar16 = (ulong)uVar9;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
  uVar18 = 0;
  bVar7 = uVar16 < uVar15;
  if (uVar16 < uVar15) {
    local_d8 = (string *)&local_200->Error;
    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_208 = 0;
    local_230 = 0;
    local_188 = 0;
    do {
      uVar9 = uVar9 + 1;
      __x = pbVar10 + uVar16;
      iVar8 = std::__cxx11::string::compare((char *)__x);
      bVar6 = true;
      if (iVar8 == 0) {
LAB_0032bb25:
        bVar6 = true;
        uVar18 = 1;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)__x);
        if (iVar8 == 0) {
LAB_0032ba54:
          bVar6 = true;
          uVar18 = 2;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)__x);
          if (iVar8 == 0) {
            uVar18 = 3;
          }
          else {
            uVar11 = std::__cxx11::string::compare((char *)__x);
            if ((int)uVar11 == 0) {
              local_188 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
            }
            else {
              uVar11 = std::__cxx11::string::compare((char *)__x);
              if ((int)uVar11 == 0) {
                local_230 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
              }
              else {
                uVar11 = std::__cxx11::string::compare((char *)__x);
                if ((int)uVar11 != 0) {
                  iVar8 = std::__cxx11::string::compare((char *)__x);
                  bVar6 = true;
                  if (iVar8 == 0) {
LAB_0032b8e1:
                    uVar18 = 4;
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)__x);
                    if (iVar8 == 0) {
                      uVar18 = 6;
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)__x);
                      if (iVar8 == 0) {
                        uVar18 = 0;
                        if (local_1f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            local_1f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                          push_back((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                     *)&local_1a8,(value_type *)&local_1f8);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::_M_erase_at_end(&local_1f8,
                                            local_1f8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)__x);
                        if (iVar8 == 0) {
                          uVar18 = 5;
                        }
                        else {
                          switch(uVar18) {
                          case 0:
                            uVar18 = 0;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_1f8,__x);
                            break;
                          case 1:
                            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                            pcVar4 = (__x->_M_dataplus)._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_260,pcVar4,pcVar4 + __x->_M_string_length);
                            cmsys::SystemTools::ConvertToUnixSlashes(&local_260);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<std::__cxx11::string>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&local_f8,&local_260);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
                              operator_delete(local_260._M_dataplus._M_p,
                                              (ulong)(local_260.field_2._M_allocated_capacity + 1));
                            }
                            goto LAB_0032bb25;
                          case 2:
                            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                            local_228._M_string_length = 0;
                            local_228.field_2._M_local_buf[0] = '\0';
                            bVar6 = cmsys::SystemTools::FileIsFullPath(__x);
                            if ((!bVar6) && (sVar12 = cmGeneratorExpression::Find(__x), sVar12 != 0)
                               ) {
                              psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_190);
                              local_c8._M_string_length = (size_type)(psVar13->_M_dataplus)._M_p;
                              local_c8._M_dataplus._M_p = (pointer)psVar13->_M_string_length;
                              local_260._M_dataplus._M_p = &DAT_00000001;
                              local_260._M_string_length = (size_type)&local_260.field_2;
                              local_260.field_2._M_local_buf[0] = 0x2f;
                              local_c8.field_2._M_allocated_capacity = 1;
                              views_00._M_len = 2;
                              views_00._M_array = (iterator)&local_c8;
                              local_c8.field_2._8_8_ = local_260._M_string_length;
                              cmCatViews_abi_cxx11_(&local_50,views_00);
                              std::__cxx11::string::operator=
                                        ((string *)&local_228,(string *)&local_50);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                operator_delete(local_50._M_dataplus._M_p,
                                                local_50.field_2._M_allocated_capacity + 1);
                              }
                            }
                            std::__cxx11::string::_M_append
                                      ((char *)&local_228,(ulong)(__x->_M_dataplus)._M_p);
                            cmsys::SystemTools::ConvertToUnixSlashes(&local_228);
                            bVar6 = cmsys::SystemTools::FileIsFullPath(&local_228);
                            if (bVar6) {
                              cmsys::SystemTools::CollapseFullPath(&local_260,&local_228);
                              std::__cxx11::string::operator=
                                        ((string *)&local_228,(string *)&local_260);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                                operator_delete(local_260._M_dataplus._M_p,
                                                (ulong)(local_260.field_2._M_allocated_capacity + 1)
                                               );
                              }
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&local_178,&local_228);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
                              operator_delete(local_228._M_dataplus._M_p,
                                              CONCAT71(local_228.field_2._M_allocated_capacity._1_7_
                                                       ,local_228.field_2._M_local_buf[0]) + 1);
                            }
                            goto LAB_0032ba54;
                          case 3:
                            std::__cxx11::string::_M_assign((string *)local_138._M_local_buf);
                            uVar18 = 3;
                            break;
                          case 4:
                            std::__cxx11::string::_M_assign((string *)&local_1c8);
                            local_1d8 = local_1c8;
                            goto LAB_0032b8e1;
                          case 5:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_118,__x);
                            uVar18 = 5;
                            break;
                          case 6:
                            std::__cxx11::string::_M_assign((string *)local_158._M_local_buf);
                            uVar18 = 6;
                            break;
                          default:
                            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_260,
                                       "Wrong syntax. Unknown type of argument.","");
                            std::__cxx11::string::_M_assign(local_d8);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
                              operator_delete(local_260._M_dataplus._M_p,
                                              (ulong)(local_260.field_2._M_allocated_capacity + 1));
                            }
                            bVar6 = false;
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0032bb2b;
                }
                local_208 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
              }
            }
            bVar6 = true;
            uVar18 = 7;
          }
        }
      }
LAB_0032bb2b:
      if (!bVar6) break;
      uVar16 = (ulong)uVar9;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
      bVar7 = uVar16 < uVar15;
    } while (uVar16 < uVar15);
    bVar17 = (byte)local_188 ^ 1;
  }
  else {
    local_230 = 0;
    local_208 = 0;
    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    bVar17 = 1;
  }
  pbVar10 = local_d0;
  if (!bVar7) {
    lVar14 = std::__cxx11::string::find_first_of((char *)local_d0,0x769f48,0);
    if (lVar14 == -1) {
      bVar7 = cmGeneratorExpression::IsValidTargetName(pbVar10);
      pcVar2 = local_190;
      if (bVar7) {
        bVar7 = cmGlobalGenerator::IsReservedTarget(pbVar10);
        bVar7 = !bVar7;
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        lVar14 = std::__cxx11::string::find((char)pbVar10,0x3a);
        bVar7 = lVar14 == -1;
      }
      if ((bVar7) || (bVar7 = cmMakefile::CheckCMP0037(pcVar2,pbVar10,UTILITY), bVar7)) {
        if (local_1f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&local_1a8
                     ,(value_type *)&local_1f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(&local_1f8,
                            local_1f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        }
        paVar1 = &local_260.field_2;
        local_260._M_string_length = 0;
        local_260.field_2._M_allocated_capacity =
             local_260.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_260._M_dataplus._M_p = (pointer)paVar1;
        bVar7 = cmMakefile::EnforceUniqueName(pcVar2,pbVar10,&local_260,true);
        if (bVar7) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar1) {
            operator_delete(local_260._M_dataplus._M_p,
                            (ulong)(local_260.field_2._M_allocated_capacity + 1));
          }
LAB_0032be2d:
          if (local_1a8._M_allocated_capacity == local_1a8._8_8_) {
            if (local_178._M_allocated_capacity == local_178._8_8_) {
              if (local_1a8._M_allocated_capacity != local_1a8._8_8_) goto LAB_0032be42;
              if ((local_230 & 1) == 0) {
                if ((local_1a8._M_allocated_capacity == local_1a8._8_8_ & (byte)local_208) != 1)
                goto LAB_0032be42;
                local_260._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_260,
                           "COMMAND_EXPAND_LISTS may not be specified without any COMMAND","");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_260);
              }
              else {
                local_260._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_260,
                           "USES_TERMINAL may not be specified without any COMMAND","");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_260);
              }
            }
            else {
              local_260._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_260,"BYPRODUCTS may not be specified without any COMMAND",
                         "");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_260);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar1) {
              operator_delete(local_260._M_dataplus._M_p,
                              (ulong)(local_260.field_2._M_allocated_capacity + 1));
            }
            bVar7 = true;
            goto LAB_0032bc82;
          }
LAB_0032be42:
          if ((local_158._8_8_ != 0 & (byte)local_230) != 1) {
            std::make_unique<cmCustomCommand>();
            cmCustomCommand::SetWorkingDirectory
                      ((cmCustomCommand *)local_260._M_dataplus._M_p,
                       (char *)local_138._M_allocated_capacity);
            _Var5._M_p = local_260._M_dataplus._M_p;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_178);
            cmCustomCommand::SetByproducts((cmCustomCommand *)_Var5._M_p,&local_68);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_68);
            _Var5._M_p = local_260._M_dataplus._M_p;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_80,&local_f8);
            cmCustomCommand::SetDepends((cmCustomCommand *)_Var5._M_p,&local_80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_80);
            _Var5._M_p = local_260._M_dataplus._M_p;
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                      (&local_98,
                       (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                       &local_1a8);
            cmCustomCommand::SetCommandLines
                      ((cmCustomCommand *)_Var5._M_p,(cmCustomCommandLines *)&local_98);
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                      (&local_98);
            cmCustomCommand::SetEscapeOldStyle
                      ((cmCustomCommand *)local_260._M_dataplus._M_p,(bool)(bVar17 & 1));
            cmCustomCommand::SetComment
                      ((cmCustomCommand *)local_260._M_dataplus._M_p,local_1d8->_M_local_buf);
            cmCustomCommand::SetUsesTerminal
                      ((cmCustomCommand *)local_260._M_dataplus._M_p,(bool)((byte)local_230 & 1));
            cmCustomCommand::SetCommandExpandLists
                      ((cmCustomCommand *)local_260._M_dataplus._M_p,(bool)((byte)local_208 & 1));
            cmCustomCommand::SetJobPool
                      ((cmCustomCommand *)local_260._M_dataplus._M_p,(string *)&local_158);
            local_180._M_t.
            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
            super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                 )(__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                   )local_260._M_dataplus._M_p;
            local_260._M_dataplus._M_p = (pointer)0x0;
            this = cmMakefile::AddUtilityCommand(pcVar2,pbVar10,local_1cc._0_1_,&local_180);
            std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                      (&local_180);
            cmTarget::AddSources(this,&local_118);
            std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                      ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                       &local_260);
            bVar7 = true;
            goto LAB_0032bc82;
          }
          local_260._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_260,"JOB_POOL is shadowed by USES_TERMINAL.","");
          std::__cxx11::string::_M_assign((string *)&local_200->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar1) {
            operator_delete(local_260._M_dataplus._M_p,
                            (ulong)(local_260.field_2._M_allocated_capacity + 1));
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_200->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar1) {
            operator_delete(local_260._M_dataplus._M_p,
                            (ulong)(local_260.field_2._M_allocated_capacity + 1));
          }
          if (bVar7) goto LAB_0032be2d;
        }
        bVar7 = false;
        goto LAB_0032bc82;
      }
    }
    else {
      local_260.field_2._8_8_ = &local_c8.field_2;
      local_c8._M_dataplus._M_p = &DAT_00000001;
      local_c8.field_2._M_local_buf[0] = (pbVar10->_M_dataplus)._M_p[lVar14];
      local_260._M_dataplus._M_p = (pointer)0x26;
      local_260._M_string_length = 0x77b333;
      local_260.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
      local_240 = 0x22;
      local_238 = "\".  This character is not allowed.";
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_260;
      local_c8._M_string_length = local_260.field_2._8_8_;
      cmCatViews_abi_cxx11_(&local_228,views_01);
      std::__cxx11::string::_M_assign((string *)&local_200->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  bVar7 = false;
LAB_0032bc82:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_allocated_capacity != &local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((bool *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,CONCAT71(uStack_127,local_128) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return bVar7;
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}